

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.cpp
# Opt level: O0

uint8_t __thiscall n_e_s::core::Ppu::read_byte(Ppu *this,uint16_t addr)

{
  uchar uVar1;
  IMmu *pIVar2;
  unsigned_short uVar3;
  int iVar4;
  undefined8 in_RCX;
  IMmu *pIVar5;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  uchar local_13;
  uint8_t tmp_buffer;
  uint8_t byte;
  uint16_t addr_local;
  Ppu *this_local;
  
  if (addr == 0x2002) {
    local_13 = Register<unsigned_char>::value(&this->registers_->status);
    this->registers_->write_toggle = false;
    clear_vblank_flag(this);
  }
  else if (addr == 0x2004) {
    local_13 = this->oam_data_[this->registers_->oamaddr];
  }
  else if (addr == 0x2007) {
    pIVar2 = this->mmu_;
    pIVar5 = pIVar2;
    uVar3 = Register<unsigned_short>::value
                      (&(this->registers_->vram_addr).super_Register<unsigned_short>);
    iVar4 = (*pIVar2->_vptr_IMmu[3])
                      (pIVar2,(ulong)uVar3,extraout_RDX,
                       CONCAT62((int6)((ulong)pIVar5 >> 0x10),uVar3));
    local_13 = (uchar)iVar4;
    uVar3 = Register<unsigned_short>::value
                      (&(this->registers_->vram_addr).super_Register<unsigned_short>);
    if (uVar3 < 0x3f00) {
      uVar1 = this->read_buffer_;
      this->read_buffer_ = local_13;
      local_13 = uVar1;
    }
    else {
      pIVar2 = this->mmu_;
      pIVar5 = pIVar2;
      uVar3 = Register<unsigned_short>::value
                        (&(this->registers_->vram_addr).super_Register<unsigned_short>);
      iVar4 = (*pIVar2->_vptr_IMmu[3])
                        (pIVar2,(ulong)(ushort)(uVar3 - 0x1000),extraout_RDX_00,
                         CONCAT62((int6)((ulong)pIVar5 >> 0x10),uVar3 - 0x1000));
      this->read_buffer_ = (uint8_t)iVar4;
    }
    increment_vram_address(this);
  }
  else {
    iVar4 = (*this->mmu_->_vptr_IMmu[3])
                      (this->mmu_,(ulong)addr,in_RDX,CONCAT62((int6)((ulong)in_RCX >> 0x10),addr));
    local_13 = (uchar)iVar4;
  }
  return local_13;
}

Assistant:

uint8_t Ppu::read_byte(uint16_t addr) {
    uint8_t byte = 0;

    if (addr == kPpuStatus) {
        byte = registers_->status.value();
        registers_->write_toggle = false;
        clear_vblank_flag();
    } else if (addr == kOamData) {
        byte = oam_data_[registers_->oamaddr];
    } else if (addr == kPpuData) {
        byte = mmu_->read_byte(registers_->vram_addr.value());
        if (registers_->vram_addr.value() < kFirstPaletteData) {
            const uint8_t tmp_buffer = read_buffer_;
            read_buffer_ = byte;
            byte = tmp_buffer;
        } else {
            read_buffer_ = mmu_->read_byte(registers_->vram_addr.value() -
                                           static_cast<uint16_t>(0x1000));
        }
        increment_vram_address();
    } else {
        byte = mmu_->read_byte(addr);
    }

    return byte;
}